

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * pugi::impl::anon_unknown_0::namespace_uri(xpath_node *node)

{
  xml_attribute_struct *pxVar1;
  char *pcVar2;
  xml_attribute xVar3;
  char *pcVar4;
  char *unaff_RBX;
  xml_node xVar5;
  char_t *__s;
  size_t sVar6;
  namespace_uri_predicate pred;
  namespace_uri_predicate pred_00;
  xml_node p;
  xml_node local_40;
  xml_node local_38;
  
  pxVar1 = (node->_attribute)._attr;
  if (pxVar1 == (xml_attribute_struct *)0x0) {
    xVar5._root = (node->_node)._root;
    pcVar2 = "";
    if (xVar5._root != (xml_node_struct *)0x0) {
      pcVar2 = "";
      if ((xVar5._root)->name != (char_t *)0x0) {
        pcVar2 = (xVar5._root)->name;
      }
    }
    pcVar4 = strchr(pcVar2,0x3a);
    sVar6 = (long)pcVar4 - (long)pcVar2;
    if (pcVar4 == (char *)0x0) {
      sVar6 = 0;
      pcVar2 = (char *)0x0;
    }
    local_40._root = xVar5._root;
    do {
      if (xVar5._root == (xml_node_struct *)0x0) goto LAB_0070fc35;
      pred_00.prefix_length = sVar6;
      pred_00.prefix = pcVar2;
      xVar3 = xml_node::find_attribute<pugi::impl::(anonymous_namespace)::namespace_uri_predicate>
                        (&local_40,pred_00);
      if (xVar3._attr == (xml_attribute_struct *)0x0) {
        xml_node::xml_node(&local_38,(xVar5._root)->parent);
        local_40._root = local_38._root;
        xVar5._root = local_38._root;
      }
      else {
        unaff_RBX = (xVar3._attr)->value;
        if (unaff_RBX == (char *)0x0) {
          unaff_RBX = "";
        }
      }
    } while (xVar3._attr == (xml_attribute_struct *)0x0);
  }
  else {
    __s = pxVar1->name;
    unaff_RBX = "";
    if (__s == (char_t *)0x0) {
      __s = "";
    }
    pcVar2 = strchr(__s,0x3a);
    if (pcVar2 != (char *)0x0) {
      xVar5._root = (node->_node)._root;
      local_40._root = xVar5._root;
      do {
        if (xVar5._root == (xml_node_struct *)0x0) {
LAB_0070fc35:
          return "";
        }
        pred.prefix_length = (long)pcVar2 - (long)__s;
        pred.prefix = __s;
        xVar3 = xml_node::find_attribute<pugi::impl::(anonymous_namespace)::namespace_uri_predicate>
                          (&local_40,pred);
        if (xVar3._attr == (xml_attribute_struct *)0x0) {
          xml_node::xml_node(&local_38,(xVar5._root)->parent);
          local_40._root = local_38._root;
          xVar5._root = local_38._root;
        }
        else {
          unaff_RBX = (xVar3._attr)->value;
          if (unaff_RBX == (char *)0x0) {
            unaff_RBX = "";
          }
        }
      } while (xVar3._attr == (xml_attribute_struct *)0x0);
    }
  }
  return unaff_RBX;
}

Assistant:

PUGI_IMPL_FN const char_t* namespace_uri(const xpath_node& node)
	{
		return node.attribute() ? namespace_uri(node.attribute(), node.parent()) : namespace_uri(node.node());
	}